

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeDataSegments(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *pBVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *this_00;
  pointer pDVar5;
  char *data;
  U32LEB local_58;
  U32LEB local_54;
  size_t local_50;
  char *local_48;
  uint32_t local_40;
  uint local_3c;
  Index memoryIndex;
  uint32_t flags;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *__range1;
  WasmBinaryWriter *pWStack_10;
  int32_t start;
  WasmBinaryWriter *this_local;
  
  pWStack_10 = this;
  sVar3 = std::
          vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ::size(&this->wasm->dataSegments);
  if (sVar3 != 0) {
    sVar3 = std::
            vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ::size(&this->wasm->dataSegments);
    if (100000 < sVar3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "Some VMs may not accept this binary because it has a large ");
      poVar4 = std::operator<<(poVar4,"number of data segments. Run the limit-segments pass to ");
      std::operator<<(poVar4,"merge segments.\n");
    }
    __range1._4_4_ = startSection<wasm::BinaryConsts::Section>(this,Data);
    pBVar1 = this->o;
    sVar3 = std::
            vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ::size(&this->wasm->dataSegments);
    LEB<unsigned_int,_unsigned_char>::LEB((LEB<unsigned_int,_unsigned_char> *)&__range1,(uint)sVar3)
    ;
    BufferWithRandomAccess::operator<<(pBVar1,__range1._0_4_);
    this_00 = &this->wasm->dataSegments;
    __end1 = std::
             vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ::begin(this_00);
    segment = (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
              std::
              vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                                       *)&segment), bVar2) {
      _memoryIndex = __gnu_cxx::
                     __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                     ::operator*(&__end1);
      local_3c = 0;
      local_40 = 0;
      pDVar5 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(_memoryIndex);
      if ((pDVar5->isPassive & 1U) == 0) {
        pDVar5 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                 operator->(_memoryIndex);
        local_50 = (pDVar5->memory).super_IString.str._M_len;
        local_48 = (pDVar5->memory).super_IString.str._M_str;
        local_40 = getMemoryIndex(this,(Name)(pDVar5->memory).super_IString.str);
        if (local_40 != 0) {
          local_3c = local_3c | 2;
        }
      }
      else {
        local_3c = local_3c | 1;
      }
      pBVar1 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_54,local_3c);
      BufferWithRandomAccess::operator<<(pBVar1,local_54);
      pDVar5 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(_memoryIndex);
      if ((pDVar5->isPassive & 1U) == 0) {
        if (local_40 != 0) {
          pBVar1 = this->o;
          LEB<unsigned_int,_unsigned_char>::LEB(&local_58,local_40);
          BufferWithRandomAccess::operator<<(pBVar1,local_58);
        }
        pDVar5 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                 operator->(_memoryIndex);
        writeExpression(this,pDVar5->offset);
        BufferWithRandomAccess::operator<<(this->o,'\v');
      }
      pDVar5 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(_memoryIndex);
      data = std::vector<char,_std::allocator<char>_>::data(&pDVar5->data);
      pDVar5 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(_memoryIndex);
      sVar3 = std::vector<char,_std::allocator<char>_>::size(&pDVar5->data);
      writeInlineBuffer(this,data,sVar3);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
      ::operator++(&__end1);
    }
    finishSection(this,__range1._4_4_);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDataSegments() {
  if (wasm->dataSegments.size() == 0) {
    return;
  }
  if (wasm->dataSegments.size() > WebLimitations::MaxDataSegments) {
    std::cerr << "Some VMs may not accept this binary because it has a large "
              << "number of data segments. Run the limit-segments pass to "
              << "merge segments.\n";
  }
  auto start = startSection(BinaryConsts::Section::Data);
  o << U32LEB(wasm->dataSegments.size());
  for (auto& segment : wasm->dataSegments) {
    uint32_t flags = 0;
    Index memoryIndex = 0;
    if (segment->isPassive) {
      flags |= BinaryConsts::IsPassive;
    } else {
      memoryIndex = getMemoryIndex(segment->memory);
      if (memoryIndex) {
        flags |= BinaryConsts::HasIndex;
      }
    }
    o << U32LEB(flags);
    if (!segment->isPassive) {
      if (memoryIndex) {
        o << U32LEB(memoryIndex);
      }
      writeExpression(segment->offset);
      o << int8_t(BinaryConsts::End);
    }
    writeInlineBuffer(segment->data.data(), segment->data.size());
  }
  finishSection(start);
}